

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O0

void Aig_NodeFixBufferFanins(Aig_Man_t *p,Aig_Obj_t *pObj,int fUpdateLevel)

{
  int iVar1;
  int iVar2;
  Aig_Type_t Type;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pResult;
  Aig_Obj_t *pFanReal1;
  Aig_Obj_t *pFanReal0;
  int fUpdateLevel_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  p->nBufFixes = p->nBufFixes + 1;
  iVar1 = Aig_ObjIsCo(pObj);
  if (iVar1 == 0) {
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                    ,0x195,"void Aig_NodeFixBufferFanins(Aig_Man_t *, Aig_Obj_t *, int)");
    }
    pAVar3 = Aig_ObjFanin0(pObj);
    iVar1 = Aig_ObjIsBuf(pAVar3);
    if (iVar1 == 0) {
      pAVar3 = Aig_ObjFanin1(pObj);
      iVar1 = Aig_ObjIsBuf(pAVar3);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsBuf(Aig_ObjFanin0(pObj)) || Aig_ObjIsBuf(Aig_ObjFanin1(pObj))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                      ,0x196,"void Aig_NodeFixBufferFanins(Aig_Man_t *, Aig_Obj_t *, int)");
      }
    }
    pAVar3 = Aig_ObjChild0(pObj);
    pAVar3 = Aig_ObjReal_rec(pAVar3);
    pAVar4 = Aig_ObjChild1(pObj);
    pAVar4 = Aig_ObjReal_rec(pAVar4);
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                    ,0x1a0,"void Aig_NodeFixBufferFanins(Aig_Man_t *, Aig_Obj_t *, int)");
    }
    Type = Aig_ObjType(pObj);
    pAVar3 = Aig_Oper(p,pAVar3,pAVar4,Type);
    Aig_ObjReplace(p,pObj,pAVar3,fUpdateLevel);
  }
  else {
    pAVar3 = Aig_ObjFanin0(pObj);
    iVar1 = Aig_ObjIsBuf(pAVar3);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsBuf(Aig_ObjFanin0(pObj))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                    ,399,"void Aig_NodeFixBufferFanins(Aig_Man_t *, Aig_Obj_t *, int)");
    }
    pAVar3 = Aig_ObjChild0(pObj);
    pAVar3 = Aig_ObjReal_rec(pAVar3);
    pAVar4 = Aig_ObjChild0(pObj);
    iVar1 = Aig_ObjPhaseReal(pAVar4);
    iVar2 = Aig_ObjPhaseReal(pAVar3);
    if (iVar1 != iVar2) {
      __assert_fail("Aig_ObjPhaseReal(Aig_ObjChild0(pObj)) == Aig_ObjPhaseReal(pFanReal0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                    ,0x191,"void Aig_NodeFixBufferFanins(Aig_Man_t *, Aig_Obj_t *, int)");
    }
    Aig_ObjPatchFanin0(p,pObj,pAVar3);
  }
  return;
}

Assistant:

void Aig_NodeFixBufferFanins( Aig_Man_t * p, Aig_Obj_t * pObj, int fUpdateLevel )
{
    Aig_Obj_t * pFanReal0, * pFanReal1, * pResult = NULL;
    p->nBufFixes++;
    if ( Aig_ObjIsCo(pObj) )
    {
        assert( Aig_ObjIsBuf(Aig_ObjFanin0(pObj)) );
        pFanReal0 = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
        assert( Aig_ObjPhaseReal(Aig_ObjChild0(pObj)) == Aig_ObjPhaseReal(pFanReal0) );
        Aig_ObjPatchFanin0( p, pObj, pFanReal0 );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    assert( Aig_ObjIsBuf(Aig_ObjFanin0(pObj)) || Aig_ObjIsBuf(Aig_ObjFanin1(pObj)) );
    // get the real fanins
    pFanReal0 = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
    pFanReal1 = Aig_ObjReal_rec( Aig_ObjChild1(pObj) );
    // get the new node
    if ( Aig_ObjIsNode(pObj) )
        pResult = Aig_Oper( p, pFanReal0, pFanReal1, Aig_ObjType(pObj) );
//    else if ( Aig_ObjIsLatch(pObj) )
//        pResult = Aig_Latch( p, pFanReal0, Aig_ObjInit(pObj) );
    else 
        assert( 0 );
    // replace the node with buffer by the node without buffer
    Aig_ObjReplace( p, pObj, pResult, fUpdateLevel );
}